

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_manager.cpp
# Opt level: O2

void __thiscall miniros::PollManager::threadFunc(PollManager *this)

{
  PollWatchers *this_00;
  Connection *pCVar1;
  Connection *pCVar2;
  Iterator<miniros::PollManager::PollWatcher> old;
  allocator<char> local_49;
  scoped_lock<miniros::observer::Target<miniros::PollManager::PollWatcher>_> lock;
  
  setThreadName("PollManager");
  disableAllSignalsInThisThread();
  this_00 = &this->poll_watchers_;
  while (((this->shutting_down_)._M_base._M_i & 1U) == 0) {
    lock._M_device = this_00;
    observer::TargetBase::lock(&this_00->super_TargetBase);
    pCVar1 = observer::TargetBase::objBegin(&this_00->super_TargetBase);
    while( true ) {
      pCVar2 = pCVar1;
      pCVar1 = observer::TargetBase::objEnd(&this_00->super_TargetBase);
      if (pCVar2 == pCVar1) break;
      pCVar1 = (Connection *)0x0;
      if (pCVar2 != (Connection *)0x0) {
        (*pCVar2->_vptr_Connection[2])(pCVar2);
        pCVar1 = pCVar2->m_next;
      }
    }
    std::scoped_lock<miniros::observer::Target<miniros::PollManager::PollWatcher>_>::~scoped_lock
              (&lock);
    if (((this->shutting_down_)._M_base._M_i & 1U) != 0) break;
    checkForShutdown();
    PollSet::update(&this->poll_set_,100);
  }
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (threadFunc::loc.initialized_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lock,"miniros.unknown_package",&local_49);
    console::initializeLogLocation(&threadFunc::loc,(string *)&lock,Info);
    std::__cxx11::string::~string((string *)&lock);
  }
  if (threadFunc::loc.level_ != Info) {
    console::setLogLocationLevel(&threadFunc::loc,Info);
    console::checkLogLocationEnabled(&threadFunc::loc);
  }
  if (threadFunc::loc.logger_enabled_ == true) {
    console::print((FilterBase *)0x0,threadFunc::loc.logger_,threadFunc::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_manager.cpp"
                   ,0x72,"void miniros::PollManager::threadFunc()","PollManager thread exit");
  }
  return;
}

Assistant:

void PollManager::threadFunc()
{
  setThreadName("PollManager");
  disableAllSignalsInThisThread();

  while (!shutting_down_)
  {
    {
      std::scoped_lock<PollWatchers> lock(poll_watchers_);
      auto it = poll_watchers_.begin();
      for (; it != poll_watchers_.end(); it++)
      {
        if (it)
          it->onPollEvents();
      }
    }

    if (shutting_down_)
    {
      break;
    }

    // While it breaks abstraction, it reduces number of mutexes and threading challenges.
    checkForShutdown();

    constexpr int updatePeriodMS = 100;

    poll_set_.update(updatePeriodMS);
  }
  MINIROS_INFO("PollManager thread exit");
}